

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

Var Js::SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
              (bool isResolve,Var value,ScriptContext *scriptContext,
              SourceTextModuleRecord *moduleRecord,bool useReturn)

{
  bool bVar1;
  ThreadContext *this;
  Var pvVar2;
  void *unaff_retaddr;
  undefined1 local_b0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  JavascriptPromise *promise;
  bool isScriptActive;
  bool useReturn_local;
  SourceTextModuleRecord *moduleRecord_local;
  ScriptContext *scriptContext_local;
  Var value_local;
  bool isResolve_local;
  
  this = ScriptContext::GetThreadContext(scriptContext);
  bVar1 = ThreadContext::IsScriptActive(this);
  __localScriptContext = (ScriptContext *)0x0;
  if (moduleRecord != (SourceTextModuleRecord *)0x0) {
    __localScriptContext = (ScriptContext *)GetPromise(moduleRecord);
  }
  if (__localScriptContext == (ScriptContext *)0x0) {
    __localScriptContext = (ScriptContext *)JavascriptPromise::CreateEnginePromise(scriptContext);
  }
  if (bVar1) {
    if (isResolve) {
      JavascriptPromise::Resolve((JavascriptPromise *)__localScriptContext,value,scriptContext);
    }
    else {
      JavascriptPromise::Reject((JavascriptPromise *)__localScriptContext,value,scriptContext);
    }
  }
  else {
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_b0,scriptContext,
               (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
               true,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_b0);
    if (isResolve) {
      JavascriptPromise::Resolve((JavascriptPromise *)__localScriptContext,value,scriptContext);
    }
    else {
      JavascriptPromise::Reject((JavascriptPromise *)__localScriptContext,value,scriptContext);
    }
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_b0);
  }
  if (moduleRecord != (SourceTextModuleRecord *)0x0) {
    SetPromise(moduleRecord,(JavascriptPromise *)0x0);
    bVar1 = ModuleRecordBase::WasEvaluated(&moduleRecord->super_ModuleRecordBase);
    if (!bVar1) {
      ModuleRecordBase::SetWasEvaluated(&moduleRecord->super_ModuleRecordBase);
    }
    if (useReturn) {
      pvVar2 = JavascriptPromise::CreatePassThroughPromise
                         ((JavascriptPromise *)__localScriptContext,scriptContext);
      return pvVar2;
    }
  }
  return __localScriptContext;
}

Assistant:

Var SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(bool isResolve, Var value, ScriptContext *scriptContext, SourceTextModuleRecord *moduleRecord, bool useReturn)
    {
        bool isScriptActive = scriptContext->GetThreadContext()->IsScriptActive();
        JavascriptPromise *promise = nullptr;
        if (moduleRecord != nullptr)
        {
            promise = moduleRecord->GetPromise();
        }

        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
        }

        ENTER_SCRIPT_IF(scriptContext, true, false, false, !isScriptActive,
        {
            if (isResolve)
            {
                promise->Resolve(value, scriptContext);
            }
            else
            {
                promise->Reject(value, scriptContext);
            }
        });

        if (moduleRecord != nullptr)
        {
            moduleRecord->SetPromise(nullptr);
            if (!moduleRecord->WasEvaluated())
            {
                moduleRecord->SetWasEvaluated();
            }
            if (useReturn)
            {
                return JavascriptPromise::CreatePassThroughPromise(promise, scriptContext);
            }
        }
        return promise;
    }